

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O0

void __thiscall chrono::ChArchiveExplorer::out(ChArchiveExplorer *this,ChNameValue<int> *bVal)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference token;
  char *pcVar4;
  ChValueSpecific<int> *this_00;
  int *mvalp;
  char *pcVar5;
  ChValueSpecific<int> *local_20;
  ChNameValue<int> *local_18;
  ChNameValue<int> *bVal_local;
  ChArchiveExplorer *this_local;
  
  if ((((this->found & 1U) == 0) || ((this->find_all & 1U) != 0)) &&
     (iVar1 = this->tablevel, local_18 = bVal, bVal_local = (ChNameValue<int> *)this,
     sVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(&this->search_tokens), (long)iVar1 == sVar3 - 1)) {
    token = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->search_tokens,(long)this->tablevel);
    pcVar4 = ChNameValue<int>::name(bVal);
    bVar2 = MatchName(this,token,pcVar4);
    if (bVar2) {
      this_00 = (ChValueSpecific<int> *)operator_new(0x38);
      mvalp = ChNameValue<int>::value(bVal);
      pcVar4 = ChNameValue<int>::name(bVal);
      pcVar5 = ChNameValue<int>::flags(bVal);
      ChValueSpecific<int>::ChValueSpecific(this_00,mvalp,pcVar4,*pcVar5);
      local_20 = this_00;
      std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::push_back
                (&this->results,(value_type *)&local_20);
      this->found = true;
    }
  }
  return;
}

Assistant:

virtual void out     (ChNameValue<int> bVal) {
            if (this->found && !this->find_all) return;
            if (this->tablevel != this->search_tokens.size()-1) return;
            if (this->MatchName(search_tokens[this->tablevel],bVal.name())) {
                this->results.push_back(new ChValueSpecific<int>(bVal.value(),bVal.name(),bVal.flags()));
                this->found = true;
            }
      }